

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

Own<kj::Directory> __thiscall kj::newInMemoryDirectory(kj *this,Clock *clock)

{
  Directory *extraout_RDX;
  Own<kj::Directory> OVar1;
  Own<kj::(anonymous_namespace)::InMemoryDirectory> local_28;
  Clock *local_18;
  Clock *clock_local;
  
  local_18 = clock;
  clock_local = (Clock *)this;
  atomicRefcounted<kj::(anonymous_namespace)::InMemoryDirectory,kj::Clock_const&>
            ((kj *)&local_28,clock);
  Own<kj::Directory>::Own<kj::(anonymous_namespace)::InMemoryDirectory,void>
            ((Own<kj::Directory> *)this,&local_28);
  Own<kj::(anonymous_namespace)::InMemoryDirectory>::~Own(&local_28);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

Own<Directory> newInMemoryDirectory(const Clock& clock) {
  return atomicRefcounted<InMemoryDirectory>(clock);
}